

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAM2PreOrOffsetIndexOp(MCInst *MI,uint Op,SStream *O)

{
  ARM_AM_AddrOpc AVar1;
  uint uVar2;
  ARM_AM_AddrOpc AVar3;
  ARM_AM_ShiftOpc AVar4;
  MCOperand *op;
  MCOperand *op_00;
  MCOperand *op_01;
  int64_t iVar5;
  char *pcVar6;
  MCInst *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint tmp;
  ARM_AM_AddrOpc subtracted;
  MCOperand *MO3;
  MCOperand *MO2;
  MCOperand *MO1;
  char *in_stack_ffffffffffffff78;
  MCInst *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  cs_struct *in_stack_ffffffffffffff90;
  MCInst *MI_00;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  op_00 = MCInst_getOperand(in_RDI,in_ESI + 1);
  op_01 = MCInst_getOperand(in_RDI,in_ESI + 2);
  iVar5 = MCOperand_getImm(op_01);
  AVar1 = getAM2Op((uint)iVar5);
  SStream_concat0((SStream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  set_mem_access(in_stack_ffffffffffffff80,SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
  MCOperand_getReg(op);
  printRegName(in_stack_ffffffffffffff90,
               (SStream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    uVar2 = MCOperand_getReg(op);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar2;
  }
  uVar2 = MCOperand_getReg(op_00);
  if (uVar2 == 0) {
    iVar5 = MCOperand_getImm(op_01);
    uVar2 = getAM2Offset((uint)iVar5);
    if (uVar2 != 0) {
      iVar5 = MCOperand_getImm(op_01);
      AVar1 = getAM2Op((uint)iVar5);
      SStream_concat0((SStream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (uVar2 < 10) {
        pcVar6 = ARM_AM_getAddrOpcStr(AVar1);
        SStream_concat((SStream *)in_RDX,"#%s%u",pcVar6,(ulong)uVar2);
      }
      else {
        pcVar6 = ARM_AM_getAddrOpcStr(AVar1);
        SStream_concat((SStream *)in_RDX,"#%s0x%x",pcVar6,(ulong)uVar2);
      }
      if (in_RDI->csh->detail != CS_OPT_OFF) {
        iVar5 = MCOperand_getImm(op_01);
        AVar3 = getAM2Op((uint)iVar5);
        *(ARM_AM_AddrOpc *)
         (in_RDI->flat_insn->detail->groups +
         (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x39) = AVar3;
        *(uint *)(in_RDI->flat_insn->detail->groups +
                 (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x3d) = uVar2;
        in_RDI->flat_insn->detail->groups
        [(ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5d] =
             AVar1 == ARM_AM_sub;
      }
    }
    SStream_concat0((SStream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    set_mem_access(in_stack_ffffffffffffff80,SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
  }
  else {
    SStream_concat0((SStream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    MI_00 = in_RDX;
    ARM_AM_getAddrOpcStr(AVar1);
    SStream_concat0((SStream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    uVar2 = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    MCOperand_getReg(op_00);
    printRegName((cs_struct *)MI_00,
                 (SStream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),uVar2);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      uVar2 = MCOperand_getReg(op_00);
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x49) = uVar2;
      in_RDI->flat_insn->detail->groups
      [(ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5d] = AVar1 == ARM_AM_sub
      ;
    }
    iVar5 = MCOperand_getImm(op_01);
    AVar4 = getAM2ShiftOpc((uint)iVar5);
    iVar5 = MCOperand_getImm(op_01);
    getAM2Offset((uint)iVar5);
    printRegImmShift(MI_00,(SStream *)CONCAT44(AVar4,in_stack_ffffffffffffff88),
                     (ARM_AM_ShiftOpc)((ulong)in_RDX >> 0x20),(uint)in_RDX);
    SStream_concat0((SStream *)in_RDX,(char *)in_RDI);
    set_mem_access(in_RDX,SUB81((ulong)in_RDI >> 0x38,0));
  }
  return;
}

Assistant:

static void printAM2PreOrOffsetIndexOp(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op + 1);
	MCOperand *MO3 = MCInst_getOperand(MI, Op + 2);
	ARM_AM_AddrOpc subtracted = getAM2Op((unsigned int)MCOperand_getImm(MO3));

	SStream_concat0(O, "[");
	set_mem_access(MI, true);

	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	}

	if (!MCOperand_getReg(MO2)) {
		unsigned tmp = getAM2Offset((unsigned int)MCOperand_getImm(MO3));
		if (tmp) { // Don't print +0.
			subtracted = getAM2Op((unsigned int)MCOperand_getImm(MO3));

			SStream_concat0(O, ", ");
			if (tmp > HEX_THRESHOLD)
				SStream_concat(O, "#%s0x%x", ARM_AM_getAddrOpcStr(subtracted), tmp);
			else
				SStream_concat(O, "#%s%u", ARM_AM_getAddrOpcStr(subtracted), tmp);
			if (MI->csh->detail) {
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.type = (arm_shifter)getAM2Op((unsigned int)MCOperand_getImm(MO3));
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.value = tmp;
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
			}
		}
		SStream_concat0(O, "]");
		set_mem_access(MI, false);
		return;
	}

	SStream_concat0(O, ", ");
	SStream_concat0(O, ARM_AM_getAddrOpcStr(subtracted));
	printRegName(MI->csh, O, MCOperand_getReg(MO2));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = MCOperand_getReg(MO2);
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
	}

	printRegImmShift(MI, O, getAM2ShiftOpc((unsigned int)MCOperand_getImm(MO3)),
			getAM2Offset((unsigned int)MCOperand_getImm(MO3)));
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}